

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O2

void __thiscall
pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::
chunked_sequence(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *this)

{
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node._M_size = 0;
  this->size_ = 0;
  std::__cxx11::
  list<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ::emplace_back<>(&this->chunks_);
  return;
}

Assistant:

chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::chunked_sequence () {
        // Create an initial, empty chunk. This avoids checking whether the chunk list is empty
        // in the (performance sensitive) append function.
        chunks_.emplace_back ();
    }